

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9InputFormat(_func_int_jx9_context_ptr_char_ptr_int_void_ptr *xConsumer,jx9_context *pCtx,
                    char *zIn,int nByte,int nArg,jx9_value **apArg,void *pUserData,int vf)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  sxi32 sVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  int iVar12;
  jx9_value *pjVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  byte *pbVar20;
  sxi64 sVar21;
  byte *pbVar22;
  uint uVar23;
  byte *pbVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ushort in_FPUControlWord;
  longdouble lVar28;
  longdouble lVar29;
  undefined1 auVar30 [16];
  char spaces [51];
  char zWorker [1024];
  uint local_51c;
  int local_518;
  uint local_514;
  uint local_510;
  int local_504;
  char *local_500;
  byte *local_4f8;
  int local_4ec;
  ushort local_4e8;
  ushort local_4e6;
  ushort local_4e4;
  ushort local_4e2;
  _func_int_jx9_context_ptr_char_ptr_int_void_ptr *local_4e0;
  jx9_context *local_4d8;
  ulong local_4d0;
  undefined1 local_4c4 [12];
  jx9_value **local_4b8;
  uint local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  char local_468 [8];
  undefined7 uStack_460;
  undefined1 uStack_459;
  undefined2 uStack_458;
  undefined1 uStack_456;
  byte *local_450;
  ulong local_448;
  undefined8 local_440;
  byte local_438 [1022];
  byte local_3a [10];
  
  builtin_strncpy(local_468,"        ",8);
  uStack_460 = 0x20202020202020;
  local_478._8_8_ = 0x2020202020202020;
  local_478._0_8_ = 0x2020202020202020;
  local_488 = _DAT_00148b60;
  pbVar22 = (byte *)(zIn + nByte);
  local_514 = (uint)(vf != 1);
  local_448 = (ulong)-(uint)(vf != 0);
  uStack_459 = 0x20;
  uStack_458 = 0x2020;
  uStack_456 = 0;
  pbVar11 = (byte *)(ulong)((int)local_438 - 1);
  local_504 = nArg;
  local_4e0 = xConsumer;
  local_4d8 = pCtx;
  local_4b8 = apArg;
  local_450 = pbVar11;
LAB_00136226:
  bVar25 = zIn < pbVar22;
  pbVar24 = (byte *)zIn;
  if ((bVar25) && (*zIn != 0x25)) {
    pbVar11 = (byte *)zIn + 1;
    do {
      pbVar24 = pbVar11;
      bVar25 = pbVar24 < pbVar22;
      pbVar11 = pbVar24;
      if (!bVar25) break;
      pbVar11 = pbVar24 + 1;
    } while (*pbVar24 != 0x25);
  }
  sVar5 = (sxi32)pbVar11;
  lVar29 = (longdouble)local_4c4._0_10_;
  if (zIn < pbVar24) {
    iVar4 = (*local_4e0)(local_4d8,zIn,(int)pbVar24 - (int)zIn,pUserData);
    sVar5 = CONCAT31((int3)((uint)iVar4 >> 8),iVar4 != -10);
    bVar25 = (bool)(bVar25 & iVar4 != -10);
    lVar29 = (longdouble)local_4c4._0_10_;
  }
  if (!bVar25) {
    return sVar5;
  }
  pbVar24 = pbVar24 + 1;
  iVar4 = 0;
  uVar6 = 0;
  iVar10 = 0;
  iVar17 = 0;
  iVar12 = 0;
  do {
    bVar3 = *pbVar24;
    pbVar11 = pbVar24;
    switch(bVar3) {
    case 0x27:
      pbVar11 = pbVar24 + 1;
      bVar3 = 0x27;
      if (pbVar11 < pbVar22) {
        bVar3 = *pbVar11;
        uStack_458 = CONCAT11(bVar3,bVar3);
        auVar30 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
        local_468._0_4_ = auVar30._0_4_;
        local_468._4_4_ = local_468._0_4_;
        local_488._8_4_ = local_468._0_4_;
        local_488[0] = (char)local_468._0_4_;
        local_488[1] = (char)((uint)local_468._0_4_ >> 8);
        local_488[2] = (char)((uint)local_468._0_4_ >> 0x10);
        local_488[3] = (char)((uint)local_468._0_4_ >> 0x18);
        local_488[4] = (char)local_468._0_4_;
        local_488[5] = (char)((uint)local_468._0_4_ >> 8);
        local_488[6] = (char)((uint)local_468._0_4_ >> 0x10);
        local_488[7] = (char)((uint)local_468._0_4_ >> 0x18);
        local_488._12_4_ = local_468._0_4_;
        uStack_460 = local_488._8_7_;
        uStack_459 = auVar30[3];
        bVar3 = 0;
        local_478 = local_488;
      }
      break;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x2f:
      break;
    case 0x2b:
      bVar3 = 0;
      iVar10 = 1;
      break;
    case 0x2d:
      bVar3 = 0;
      iVar4 = 1;
      break;
    case 0x30:
      bVar3 = 0;
      iVar17 = 1;
      break;
    default:
      if (bVar3 == 0x20) {
        bVar3 = 0;
        uVar6 = 1;
      }
      else if (bVar3 == 0x23) {
        bVar3 = 0;
        iVar12 = 1;
      }
    }
    pbVar24 = pbVar11;
  } while ((bVar3 == 0) && (pbVar24 = pbVar11 + 1, pbVar11 < pbVar22));
  if (pbVar24 < pbVar22) {
    pbVar20 = (byte *)0x0;
    pbVar11 = pbVar24;
    do {
      pbVar24 = pbVar11 + 1;
      bVar3 = *pbVar11 - 0x30;
      iVar19 = (int)pbVar20;
      if (9 < bVar3) {
        if (*pbVar11 == 0x24) {
          if (0 < iVar19) {
            local_514 = (int)local_448 + iVar19;
          }
          if ((pbVar24 < pbVar22) && (*pbVar24 == 0x30)) {
            iVar17 = 1;
            pbVar24 = pbVar11 + 2;
          }
          if (pbVar22 <= pbVar24) goto LAB_00136404;
          pbVar20 = (byte *)0x0;
          goto LAB_001363e7;
        }
        break;
      }
      pbVar20 = (byte *)(ulong)((uint)bVar3 + iVar19 * 10);
      pbVar11 = pbVar24;
    } while (pbVar24 < pbVar22);
  }
  else {
LAB_00136404:
    pbVar20 = (byte *)0x0;
    pbVar11 = pbVar24;
  }
  goto LAB_00136407;
  while( true ) {
    pbVar20 = (byte *)(ulong)((uint)(byte)(*pbVar24 - 0x30) + (int)pbVar20 * 10);
    pbVar24 = pbVar24 + 1;
    pbVar11 = pbVar24;
    if (pbVar22 <= pbVar24) break;
LAB_001363e7:
    pbVar11 = pbVar24;
    if (9 < (byte)(*pbVar24 - 0x30)) break;
  }
LAB_00136407:
  iVar19 = (int)pbVar20;
  local_4f8 = (byte *)0x3f6;
  if (iVar19 < 0x3f6) {
    local_4f8 = pbVar20;
  }
  uVar23 = 0xffffffff;
  pbVar24 = local_4f8;
  if ((pbVar11 < pbVar22) && (*pbVar11 == 0x2e)) {
    pbVar11 = pbVar11 + 1;
    uVar23 = 0;
    if (pbVar11 < pbVar22) {
      uVar23 = 0;
      do {
        bVar3 = *pbVar11 - 0x30;
        pbVar24 = (byte *)CONCAT71((int7)((ulong)pbVar24 >> 8),bVar3);
        if (9 < bVar3) break;
        pbVar24 = (byte *)(ulong)bVar3;
        uVar23 = (uint)bVar3 + uVar23 * 10;
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 < pbVar22);
    }
  }
  if (pbVar22 <= pbVar11) {
    return (sxi32)pbVar24;
  }
  zIn = (char *)(pbVar11 + 1);
  lVar7 = 0;
  do {
    if (*pbVar11 == (&aFmt[0].fmttype)[lVar7]) {
      pcVar14 = &aFmt[0].fmttype + lVar7;
      bVar3 = (&aFmt[0].type)[lVar7];
      goto LAB_0013648d;
    }
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x1e0);
  bVar3 = 9;
  pcVar14 = (char *)0x0;
LAB_0013648d:
  local_51c = 0;
  pbVar24 = (byte *)(ulong)(bVar3 - 1);
  pbVar11 = pbVar24;
  local_518 = iVar4;
  local_4c4._0_10_ = lVar29;
  if (7 < bVar3 - 1) {
switchD_001364b1_caseD_4:
    local_438[0] = 0x3f;
LAB_00136593:
    local_51c = 1;
    pcVar14 = (char *)local_438;
    goto LAB_00136f17;
  }
  pbVar11 = (byte *)((long)&switchD_001364b1::switchdataD_00143690 +
                    (long)(int)(&switchD_001364b1::switchdataD_00143690)[(long)pbVar24]);
  local_4c4._4_6_ = (undefined6)((unkuint10)lVar29 >> 0x20);
  switch(pbVar24) {
  case (byte *)0x0:
    if ((int)local_514 < local_504) {
      lVar7 = (long)(int)local_514;
      local_514 = local_514 + 1;
      pjVar13 = local_4b8[lVar7];
    }
    else {
      pjVar13 = (jx9_value *)0x0;
    }
    local_4c4._0_4_ = iVar12;
    if (pjVar13 == (jx9_value *)0x0) {
      sVar21 = 0;
      local_510 = uVar6;
      local_500 = pcVar14;
    }
    else {
      local_510 = uVar6;
      local_500 = pcVar14;
      jx9MemObjToInteger(pjVar13);
      sVar21 = (pjVar13->x).iVal;
    }
    if (0x3d7 < (int)uVar23) {
      uVar23 = 0x3d8;
    }
    if ((*(int *)(local_500 + 4) & 1) == 0) {
      lVar7 = -sVar21;
      if (0 < sVar21) {
        lVar7 = sVar21;
      }
      bVar25 = true;
      iVar4 = 0;
      bVar3 = 0;
    }
    else if (sVar21 < 0) {
      lVar7 = -sVar21;
      bVar3 = 0x2d;
      iVar4 = -1;
      bVar25 = false;
    }
    else {
      if (iVar10 == 0) {
        iVar4 = -(uint)(local_510 != 0);
        bVar3 = (local_510 != 0) << 5;
      }
      else {
        bVar3 = 0x2b;
        iVar4 = -1;
      }
      bVar25 = iVar10 == 0 && local_510 == 0;
      lVar7 = sVar21;
    }
    uVar6 = iVar4 + (int)local_4f8;
    if (iVar4 + (int)local_4f8 < (int)uVar23) {
      uVar6 = uVar23;
    }
    pcVar1 = *(char **)(local_500 + 0x10);
    bVar8 = local_500[1];
    iVar4 = -1;
    pbVar11 = local_3a;
    uVar9 = 1;
    do {
      local_51c = uVar9;
      pcVar14 = (char *)pbVar11;
      lVar15 = lVar7 / (long)(ulong)bVar8;
      *pcVar14 = pcVar1[lVar7 % (long)(ulong)bVar8];
      iVar4 = iVar4 + -1;
      lVar7 = lVar15;
      pbVar11 = (byte *)pcVar14 + -1;
      uVar9 = local_51c + 1;
    } while (0 < lVar15);
    if (iVar17 == 0) {
      uVar6 = uVar23;
    }
    if ((int)local_51c < (int)uVar6) {
      pcVar14 = (char *)((byte *)pcVar14 + -1 + -(ulong)(iVar4 + uVar6));
      memset(pcVar14,0x30,(ulong)(uVar6 - (local_51c + 1)) + 1);
    }
    if (!bVar25) {
      ((byte *)pcVar14)[-1] = bVar3;
      pcVar14 = (char *)((byte *)pcVar14 + -1);
    }
    if (((local_4c4._0_4_ != 0 && sVar21 != 0) &&
        (pbVar11 = *(byte **)(local_500 + 0x18), pbVar11 != (byte *)0x0)) && (*pcVar14 != *pbVar11))
    {
      bVar3 = *pbVar11;
      while (bVar3 != 0) {
        pbVar11 = pbVar11 + 1;
        ((byte *)pcVar14)[-1] = bVar3;
        pcVar14 = (char *)((byte *)pcVar14 + -1);
        bVar3 = *pbVar11;
      }
    }
    local_51c = ((int)local_3a + 1) - (int)pcVar14;
    pbVar11 = (byte *)(ulong)local_51c;
    iVar4 = local_518;
    goto LAB_00136f17;
  default:
    uVar18 = local_4d0 >> 8;
    local_4d0 = CONCAT71((int7)uVar18,bVar3);
    if ((int)local_514 < local_504) {
      lVar7 = (long)(int)local_514;
      local_514 = local_514 + 1;
      pjVar13 = local_4b8[lVar7];
    }
    else {
      pjVar13 = (jx9_value *)0x0;
    }
    lVar28 = (longdouble)0;
    local_500 = pcVar14;
    local_4ec = iVar10;
    if (pjVar13 != (jx9_value *)0x0) {
      local_4c4._0_4_ = iVar12;
      local_510 = uVar6;
      jx9MemObjToReal(pjVar13);
      lVar28 = (longdouble)(pjVar13->x).rVal;
      lVar29 = (longdouble)local_4c4._0_10_;
      uVar6 = local_510;
      iVar12 = local_4c4._0_4_;
    }
    local_4c4._0_10_ = lVar29;
    uVar9 = 0x3d8;
    if ((int)uVar23 < 0x3d8) {
      uVar9 = uVar23;
    }
    if ((int)uVar23 < 0) {
      uVar9 = 6;
    }
    if ((longdouble)0 <= lVar28) {
      if (local_4ec == 0) {
        bVar25 = uVar6 == 0;
        uVar18 = (ulong)!bVar25;
        pbVar11 = (byte *)(ulong)(byte)(!bVar25 << 5);
      }
      else {
        pbVar11 = (byte *)0x2b;
        uVar18 = 1;
        bVar25 = false;
      }
    }
    else {
      lVar28 = -lVar28;
      pbVar11 = (byte *)0x2d;
      uVar18 = 1;
      bVar25 = false;
    }
    uVar16 = 0;
    uVar6 = (uint)(0 < (int)uVar9 && local_500[8] == '\x04');
    iVar4 = uVar9 - uVar6;
    lVar29 = (longdouble)0.5;
    if (0 < iVar4) {
      uVar6 = -uVar6;
      uVar16 = (ulong)uVar6;
      iVar10 = uVar9 + uVar6 + 1;
      local_440 = 0.5;
      do {
        local_440 = local_440 * 0.1;
        iVar10 = iVar10 + -1;
      } while (1 < iVar10);
      lVar29 = (longdouble)local_440;
    }
    if (local_500[8] == '\x02') {
      lVar28 = lVar28 + lVar29;
    }
    uVar6 = 0;
    if ((longdouble)0 < lVar28) {
      uVar6 = 0;
      if ((longdouble)1e+08 <= lVar28) {
        uVar23 = 0;
        do {
          lVar28 = lVar28 * (longdouble)1e-08;
          uVar6 = uVar23 + 8;
          if (lVar28 < (longdouble)1e+08) break;
          bVar26 = uVar23 < 0x157;
          uVar23 = uVar6;
        } while (bVar26);
      }
      uVar23 = uVar6;
      if (uVar6 < 0x15f && (longdouble)10.0 <= lVar28) {
        do {
          lVar28 = lVar28 * (longdouble)0.1;
          uVar6 = uVar23 + 1;
          if (lVar28 < (longdouble)10.0) break;
          bVar26 = uVar23 < 0x15e;
          uVar23 = uVar6;
        } while (bVar26);
      }
      uVar16 = uVar16 & 0xffffffffffffff00;
      uVar23 = uVar6;
      if (-0x15f < (int)uVar6 && lVar28 < (longdouble)1e-08) {
        do {
          lVar28 = lVar28 * (longdouble)1e+08;
          uVar6 = uVar23 - 8;
          if ((longdouble)1e-08 <= lVar28) break;
          bVar26 = -0x157 < (int)uVar23;
          uVar23 = uVar6;
        } while (bVar26);
      }
      if ((lVar28 < (longdouble)1) && (uVar23 = uVar6, -0x15f < (int)uVar6)) {
        do {
          lVar28 = lVar28 * (longdouble)10.0;
          uVar6 = uVar23 - 1;
          if ((longdouble)1 <= lVar28) break;
          bVar26 = -0x15e < (int)uVar23;
          uVar23 = uVar6;
        } while (bVar26);
      }
      if (uVar6 - 0x15f < 0xfffffd43) {
        local_51c = 3;
        pcVar14 = "NaN";
        iVar4 = local_518;
        goto LAB_00136f17;
      }
    }
    bVar26 = (char)local_4d0 == '\x02';
    if ((!bVar26) && (lVar28 = lVar29 + lVar28, (longdouble)10.0 <= lVar28)) {
      lVar28 = lVar28 * (longdouble)0.1;
      uVar6 = uVar6 + 1;
    }
    if ((char)local_4d0 == '\x04') {
      uVar16 = CONCAT71((int7)(uVar16 >> 8),iVar12 == 0);
      bVar26 = (int)uVar6 <= iVar4 && -5 < (int)uVar6;
      uVar23 = 0;
      if ((int)uVar6 <= iVar4 && -5 < (int)uVar6) {
        uVar23 = uVar6;
      }
      iVar4 = iVar4 - uVar23;
    }
    else {
      uVar16 = 0;
    }
    bVar2 = 0 < iVar4;
    bVar27 = iVar12 != 0;
    bVar3 = bVar27 || bVar2;
    if ((bVar26) && ((int)(iVar4 + uVar6) < 0x3e2)) {
      pbVar24 = local_438;
      if (!bVar25) {
        local_438[0] = (byte)pbVar11;
        pbVar24 = local_438 + 1;
      }
      if ((int)uVar6 < 0) {
        *pbVar24 = 0x30;
        pbVar24 = pbVar24 + 1;
        uVar6 = uVar6 + 1;
        uVar23 = 0;
      }
      else {
        uVar23 = uVar6 + 1;
        lVar7 = 0;
        do {
          bVar8 = 0x30;
          if ((uint)lVar7 < 0x10) {
            local_4e2 = in_FPUControlWord | 0xc00;
            local_4a0 = (int)ROUND(lVar28);
            lVar28 = (lVar28 - (longdouble)local_4a0) * (longdouble)10.0;
            bVar8 = (char)local_4a0 + 0x30;
            local_49c = local_4a0;
          }
          pbVar24[lVar7] = bVar8;
          lVar7 = lVar7 + 1;
        } while (uVar6 + 1 != (int)lVar7);
        pbVar24 = pbVar24 + lVar7;
        uVar6 = 0;
      }
      if (bVar27 || bVar2) {
        *pbVar24 = 0x2e;
        pbVar24 = pbVar24 + 1;
      }
      if (((int)uVar6 < 0) && (0 < iVar4)) {
        local_4ac = -iVar4;
        if ((uint)-iVar4 < uVar6) {
          local_4ac = uVar6;
        }
        local_510 = (uint)uVar16;
        local_500 = (char *)CONCAT44(local_500._4_4_,iVar17);
        local_4ec = CONCAT31(local_4ec._1_3_,bVar3);
        local_4d0 = uVar18;
        local_4c4._0_10_ = lVar28;
        memset(pbVar24,0x30,(ulong)-local_4ac);
        uVar16 = (ulong)local_510;
        pbVar24 = pbVar24 + (ulong)~local_4ac + 1;
        iVar4 = local_4ac + iVar4;
        uVar18 = local_4d0;
        lVar28 = (longdouble)local_4c4._0_10_;
        iVar17 = (int)local_500;
        bVar3 = (byte)local_4ec;
      }
      if (0 < iVar4) {
        iVar4 = iVar4 + 1;
        do {
          bVar8 = 0x30;
          if (uVar23 < 0x10) {
            local_4e4 = in_FPUControlWord | 0xc00;
            local_4a8 = (int)ROUND(lVar28);
            lVar28 = (lVar28 - (longdouble)local_4a8) * (longdouble)10.0;
            bVar8 = (char)local_4a8 + 0x30;
            local_4a4 = local_4a8;
          }
          *pbVar24 = bVar8;
          pbVar24 = pbVar24 + 1;
          iVar4 = iVar4 + -1;
          uVar23 = uVar23 + 1;
        } while (1 < iVar4);
      }
      *pbVar24 = 0;
      pbVar24 = pbVar24 + -1;
      if (((byte)uVar16 & bVar3) == 1) {
        for (; local_438 <= pbVar24; pbVar24 = pbVar24 + -1) {
          if (*pbVar24 != 0x30) {
            if (*pbVar24 == 0x2e) {
              *pbVar24 = 0;
              pbVar24 = pbVar24 + -1;
            }
            break;
          }
          *pbVar24 = 0;
        }
      }
LAB_00136c09:
      iVar12 = (int)pbVar24 + 1;
    }
    else {
      pbVar24 = local_438;
      if (!bVar25) {
        local_438[0] = (byte)pbVar11;
        pbVar24 = local_438 + 1;
      }
      local_4e6 = in_FPUControlWord | 0xc00;
      local_490 = (int)ROUND(lVar28);
      lVar29 = (lVar28 - (longdouble)local_490) * (longdouble)10.0;
      *pbVar24 = (char)local_490 + 0x30;
      if (bVar27 || bVar2) {
        pbVar24[1] = 0x2e;
        pbVar24 = pbVar24 + 2;
      }
      else {
        pbVar24 = pbVar24 + 1;
      }
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          bVar8 = 0x30;
          if ((int)lVar7 + 1U < 0x10) {
            local_4e8 = in_FPUControlWord | 0xc00;
            local_498 = (int)ROUND(lVar29);
            lVar29 = (lVar29 - (longdouble)local_498) * (longdouble)10.0;
            bVar8 = (char)local_498 + 0x30;
            local_494 = local_498;
          }
          pbVar24[lVar7] = bVar8;
          lVar7 = lVar7 + 1;
        } while ((ulong)(iVar4 - 1) + 1 != lVar7);
        pbVar24 = pbVar24 + lVar7;
      }
      pbVar24 = pbVar24 + -1;
      if (((byte)uVar16 & bVar3) == 1) {
        for (; local_438 <= pbVar24; pbVar24 = pbVar24 + -1) {
          if (*pbVar24 != 0x30) {
            if (*pbVar24 == 0x2e) {
              *pbVar24 = 0;
              pbVar24 = pbVar24 + -1;
            }
            break;
          }
          *pbVar24 = 0;
        }
      }
      local_48c = local_490;
      if (((char)local_4d0 != '\x03') && (uVar6 == 0)) goto LAB_00136c09;
      pbVar24[1] = **(byte **)(local_500 + 0x10);
      if ((int)uVar6 < 0) {
        pbVar24[2] = 0x2d;
        uVar6 = -uVar6;
      }
      else {
        pbVar24[2] = 0x2b;
      }
      if ((int)uVar6 < 100) {
        pbVar24 = pbVar24 + 3;
      }
      else {
        pbVar24[3] = (char)(uVar6 / 100) + 0x30;
        pbVar24 = pbVar24 + 4;
        uVar6 = uVar6 % 100;
      }
      *pbVar24 = (char)(uVar6 / 10) + 0x30;
      pbVar24[1] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      iVar12 = (int)pbVar24 + 2;
    }
    iVar4 = local_518;
    pcVar14 = (char *)local_438;
    local_51c = iVar12 - (int)pcVar14;
    pbVar11 = (byte *)(ulong)local_51c;
    if ((iVar17 == 0) || (local_518 != 0)) goto LAB_00136f17;
    uVar6 = (uint)local_4f8;
    if (uVar6 - local_51c == 0 || (int)uVar6 < (int)local_51c) goto LAB_00136f17;
    if (-1 < (int)local_51c) {
      if (0x3f5 < iVar19) {
        iVar19 = 0x3f6;
      }
      lVar7 = (long)iVar19 + 1;
      lVar15 = (long)(int)local_51c;
      do {
        local_438[lVar7 + -1] = local_438[lVar15];
        lVar7 = lVar7 + -1;
        lVar15 = lVar15 + -1;
      } while ((int)(uVar6 - local_51c) < lVar7);
    }
    if (uVar6 != local_51c) {
      pbVar11 = (byte *)memset(local_438 + uVar18,0x30,
                               (ulong)(((int)local_450 + uVar6) - iVar12) + 1);
    }
    break;
  case (byte *)0x4:
    goto switchD_001364b1_caseD_4;
  case (byte *)0x5:
    pbVar11 = (byte *)(ulong)local_514;
    if ((int)local_514 < local_504) {
      pbVar11 = (byte *)(long)(int)local_514;
      local_514 = local_514 + 1;
      pjVar13 = local_4b8[(long)pbVar11];
    }
    else {
      pjVar13 = (jx9_value *)0x0;
    }
    if (pjVar13 == (jx9_value *)0x0) {
      local_51c = 0;
      pcVar14 = (char *)local_438;
    }
    else {
      pbVar11 = (byte *)jx9_value_to_string(pjVar13,(int *)&local_51c);
      pcVar14 = (char *)pbVar11;
    }
    if ((int)local_51c < 1) {
      local_51c = 1;
      pcVar14 = " ";
    }
    if ((-1 < (int)uVar23) && ((int)uVar23 < (int)local_51c)) {
      local_51c = uVar23;
    }
    iVar4 = local_518;
    if (iVar17 != 0) {
      local_468 = DAT_00144260._0_8_;
      uStack_460 = DAT_00144260._8_7_;
      uStack_459 = DAT_00144260._15_1_;
      local_478 = _DAT_00144260;
      local_488 = _DAT_00144260;
      uStack_458 = 0x3030;
    }
    goto LAB_00136f17;
  case (byte *)0x6:
    local_438[0] = 0x25;
    goto LAB_00136593;
  case (byte *)0x7:
    if ((int)local_514 < local_504) {
      lVar7 = (long)(int)local_514;
      local_514 = local_514 + 1;
      pjVar13 = local_4b8[lVar7];
    }
    else {
      pjVar13 = (jx9_value *)0x0;
    }
    if (pjVar13 == (jx9_value *)0x0) {
      pbVar11 = (byte *)0x0;
    }
    else {
      sVar5 = jx9MemObjToInteger(pjVar13);
      pbVar11 = (byte *)(ulong)CONCAT31((int3)((uint)sVar5 >> 8),*(undefined1 *)&pjVar13->x);
    }
    local_438[0] = (byte)pbVar11;
    local_51c = 1;
    uVar6 = local_51c;
  }
  local_51c = uVar6;
  pcVar14 = (char *)local_438;
LAB_00136f17:
  if ((iVar4 == 0) &&
     (iVar4 = (int)local_4f8 - local_51c, iVar4 != 0 && (int)local_51c <= (int)local_4f8)) {
    iVar12 = iVar4;
    if (0x31 < iVar4) {
      do {
        uVar6 = (*local_4e0)(local_4d8,local_488,0x32,pUserData);
        pbVar11 = (byte *)(ulong)uVar6;
        if (uVar6 != 0) {
          return uVar6;
        }
        iVar4 = iVar12 + -0x32;
        bVar25 = 99 < iVar12;
        iVar12 = iVar4;
      } while (bVar25);
    }
    if (0 < iVar4) {
      uVar6 = (*local_4e0)(local_4d8,local_488,iVar4,pUserData);
      pbVar11 = (byte *)(ulong)uVar6;
      if (uVar6 != 0) {
        return uVar6;
      }
    }
  }
  if (0 < (int)local_51c) {
    uVar6 = (*local_4e0)(local_4d8,pcVar14,local_51c,pUserData);
    pbVar11 = (byte *)(ulong)uVar6;
    if (uVar6 != 0) {
      return uVar6;
    }
  }
  if (local_518 != 0) {
    iVar4 = (int)local_4f8;
    uVar6 = iVar4 - local_51c;
    pbVar11 = (byte *)(ulong)uVar6;
    local_4f8 = pbVar11;
    if (uVar6 != 0 && (int)local_51c <= iVar4) {
      pbVar24 = pbVar11;
      if (0x31 < (int)uVar6) {
        do {
          uVar6 = (*local_4e0)(local_4d8,local_488,0x32,pUserData);
          pbVar11 = (byte *)(ulong)uVar6;
          if (uVar6 != 0) {
            return uVar6;
          }
          iVar4 = (int)pbVar24;
          uVar6 = iVar4 - 0x32;
          pbVar24 = (byte *)(ulong)uVar6;
        } while (99 < iVar4);
      }
      if (0 < (int)uVar6) {
        uVar6 = (*local_4e0)(local_4d8,local_488,uVar6,pUserData);
        pbVar11 = (byte *)(ulong)uVar6;
        if (uVar6 != 0) {
          return uVar6;
        }
      }
    }
  }
  goto LAB_00136226;
}

Assistant:

JX9_PRIVATE sxi32 jx9InputFormat(
	int (*xConsumer)(jx9_context *, const char *, int, void *), /* Format consumer */
	jx9_context *pCtx,  /* call context */
	const char *zIn,    /* Format string */
	int nByte,          /* Format string length */
	int nArg,           /* Total argument of the given arguments */
	jx9_value **apArg,  /* User arguments */
	void *pUserData,    /* Last argument to xConsumer() */
	int vf              /* TRUE if called from vfprintf, vsprintf context */ 
	)
{
	char spaces[] = "                                                  ";
#define etSPACESIZE ((int)sizeof(spaces)-1)
	const char *zCur, *zEnd = &zIn[nByte];
	char *zBuf, zWorker[JX9_FMT_BUFSIZ];       /* Working buffer */
	const jx9_fmt_info *pInfo;  /* Pointer to the appropriate info structure */
	int flag_alternateform; /* True if "#" flag is present */
	int flag_leftjustify;   /* True if "-" flag is present */
	int flag_blanksign;     /* True if " " flag is present */
	int flag_plussign;      /* True if "+" flag is present */
	int flag_zeropad;       /* True if field width constant starts with zero */
	jx9_value *pArg;         /* Current processed argument */
	jx9_int64 iVal;
	int precision;           /* Precision of the current field */
	char *zExtra;  
	int c, rc, n;
	int length;              /* Length of the field */
	int prefix;
	sxu8 xtype;              /* Conversion paradigm */
	int width;               /* Width of the current field */
	int idx;
	n = (vf == TRUE) ? 0 : 1;
#define NEXT_ARG	( n < nArg ? apArg[n++] : 0 )
	/* Start the format process */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '%' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Consume chunk verbatim */
			rc = xConsumer(pCtx, zCur, (int)(zIn-zCur), pUserData);
			if( rc == SXERR_ABORT ){
				/* Callback request an operation abort */
				break;
			}
		}
		if( zIn >= zEnd ){
			/* No more input to process, break immediately */
			break;
		}
		/* Find out what flags are present */
		flag_leftjustify = flag_plussign = flag_blanksign = 
			flag_alternateform = flag_zeropad = 0;
		zIn++; /* Jump the precent sign */
		do{
			c = zIn[0];
			switch( c ){
			case '-':   flag_leftjustify = 1;     c = 0;   break;
			case '+':   flag_plussign = 1;        c = 0;   break;
			case ' ':   flag_blanksign = 1;       c = 0;   break;
			case '#':   flag_alternateform = 1;   c = 0;   break;
			case '0':   flag_zeropad = 1;         c = 0;   break;
			case '\'':
				zIn++;
				if( zIn < zEnd ){
					/* An alternate padding character can be specified by prefixing it with a single quote (') */
					c = zIn[0];
					for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
						spaces[idx] = (char)c;
					}
					c = 0;
				}
				break;
			default:                                       break;
			}
		}while( c==0 && (zIn++ < zEnd) );
		/* Get the field width */
		width = 0;
		while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
			width = width*10 + (zIn[0] - '0');
			zIn++;
		}
		if( zIn < zEnd && zIn[0] == '$' ){
			/* Position specifer */
			if( width > 0 ){
				n = width;
				if( vf && n > 0 ){ 
					n--;
				}
			}
			zIn++;
			width = 0;
			if( zIn < zEnd && zIn[0] == '0' ){
				flag_zeropad = 1;
				zIn++;
			}
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				width = width*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( width > JX9_FMT_BUFSIZ-10 ){
			width = JX9_FMT_BUFSIZ-10;
		}
		/* Get the precision */
		precision = -1;
		if( zIn < zEnd && zIn[0] == '.' ){
			precision = 0;
			zIn++;
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				precision = precision*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( zIn >= zEnd ){
			/* No more input */
			break;
		}
		/* Fetch the info entry for the field */
		pInfo = 0;
		xtype = JX9_FMT_ERROR;
		c = zIn[0];
		zIn++; /* Jump the format specifer */
		for(idx=0; idx< (int)SX_ARRAYSIZE(aFmt); idx++){
			if( c==aFmt[idx].fmttype ){
				pInfo = &aFmt[idx];
				xtype = pInfo->type;
				break;
			}
		}
		zBuf = zWorker; /* Point to the working buffer */
		length = 0;
		zExtra = 0;
		 /*
		  ** At this point, variables are initialized as follows:
		  **
		  **   flag_alternateform          TRUE if a '#' is present.
		  **   flag_plussign               TRUE if a '+' is present.
		  **   flag_leftjustify            TRUE if a '-' is present or if the
		  **                               field width was negative.
		  **   flag_zeropad                TRUE if the width began with 0.
		  **                               the conversion character.
		  **   flag_blanksign              TRUE if a ' ' is present.
		  **   width                       The specified field width.  This is
		  **                               always non-negative.  Zero is the default.
		  **   precision                   The specified precision.  The default
		  **                               is -1.
		  */
		switch(xtype){
		case JX9_FMT_PERCENT:
			/* A literal percent character */
			zWorker[0] = '%';
			length = (int)sizeof(char);
			break;
		case JX9_FMT_CHARX:
			/* The argument is treated as an integer, and presented as the character
			 * with that ASCII value
			 */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				c = 0;
			}else{
				c = jx9_value_to_int(pArg);
			}
			/* NUL byte is an acceptable value */
			zWorker[0] = (char)c;
			length = (int)sizeof(char);
			break;
		case JX9_FMT_STRING:
			/* the argument is treated as and presented as a string */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				length = 0;
			}else{
				zBuf = (char *)jx9_value_to_string(pArg, &length);
			}
			if( length < 1 ){
				zBuf = " ";
				length = (int)sizeof(char);
			}
			if( precision>=0 && precision<length ){
				length = precision;
			}
			if( flag_zeropad ){
				/* zero-padding works on strings too */
				for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
					spaces[idx] = '0';
				}
			}
			break;
		case JX9_FMT_RADIX:
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				iVal = 0;
			}else{
				iVal = jx9_value_to_int64(pArg);
			}
			/* Limit the precision to prevent overflowing buf[] during conversion */
			if( precision>JX9_FMT_BUFSIZ-40 ){
				precision = JX9_FMT_BUFSIZ-40;
			}
#if 1
        /* For the format %#x, the value zero is printed "0" not "0x0".
        ** I think this is stupid.*/
        if( iVal==0 ) flag_alternateform = 0;
#else
        /* More sensible: turn off the prefix for octal (to prevent "00"), 
        ** but leave the prefix for hex.*/
        if( iVal==0 && pInfo->base==8 ) flag_alternateform = 0;
#endif
        if( pInfo->flags & JX9_FMT_FLAG_SIGNED ){
          if( iVal<0 ){ 
            iVal = -iVal;
			/* Ticket 1433-003 */
			if( iVal < 0 ){
				/* Overflow */
				iVal= 0x7FFFFFFFFFFFFFFF;
			}
            prefix = '-';
          }else if( flag_plussign )  prefix = '+';
          else if( flag_blanksign )  prefix = ' ';
          else                       prefix = 0;
        }else{
			if( iVal<0 ){
				iVal = -iVal;
				/* Ticket 1433-003 */
				if( iVal < 0 ){
					/* Overflow */
					iVal= 0x7FFFFFFFFFFFFFFF;
				}
			}
			prefix = 0;
		}
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        zBuf = &zWorker[JX9_FMT_BUFSIZ-1];
        {
          register char *cset;      /* Use registers for speed */
          register int base;
          cset = pInfo->charset;
          base = pInfo->base;
          do{                                           /* Convert to ascii */
            *(--zBuf) = cset[iVal%base];
            iVal = iVal/base;
          }while( iVal>0 );
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
        for(idx=precision-length; idx>0; idx--){
          *(--zBuf) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--zBuf) = (char)prefix;               /* Add sign */
        if( flag_alternateform && pInfo->prefix ){      /* Add "0" or "0x" */
          char *pre, x;
          pre = pInfo->prefix;
          if( *zBuf!=pre[0] ){
            for(pre=pInfo->prefix; (x=(*pre))!=0; pre++) *(--zBuf) = x;
          }
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
		break;
		case JX9_FMT_FLOAT:
		case JX9_FMT_EXP:
		case JX9_FMT_GENERIC:{
#ifndef JX9_OMIT_FLOATING_POINT
		long double realvalue;
		int  exp;                /* exponent of real numbers */
		double rounder;          /* Used for rounding floating point values */
		int flag_dp;            /* True if decimal point should be shown */
		int flag_rtz;           /* True if trailing zeros should be removed */
		int flag_exp;           /* True to force display of the exponent */
		int nsd;                 /* Number of significant digits returned */
		pArg = NEXT_ARG;
		if( pArg == 0 ){
			realvalue = 0;
		}else{
			realvalue = jx9_value_to_double(pArg);
		}
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( precision>JX9_FMT_BUFSIZ-40) precision = JX9_FMT_BUFSIZ-40;
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( pInfo->type==JX9_FMT_GENERIC && precision>0 ) precision--;
        rounder = 0.0;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1);
#endif
        if( pInfo->type==JX9_FMT_FLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( realvalue>0.0 ){
          while( realvalue>=1e8 && exp<=350 ){ realvalue *= 1e-8; exp+=8; }
          while( realvalue>=10.0 && exp<=350 ){ realvalue *= 0.1; exp++; }
          while( realvalue<1e-8 && exp>=-350 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 && exp>=-350 ){ realvalue *= 10.0; exp--; }
          if( exp>350 || exp<-350 ){
            zBuf = "NaN";
            length = 3;
            break;
          }
        }
        zBuf = zWorker;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        flag_exp = xtype==JX9_FMT_EXP;
        if( xtype!=JX9_FMT_FLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==JX9_FMT_GENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = JX9_FMT_EXP;
          }else{
            precision = precision - exp;
            xtype = JX9_FMT_FLOAT;
          }
        }else{
          flag_rtz = 0;
        }
        /*
        ** The "exp+precision" test causes output to be of type etEXP if
        ** the precision is too large to fit in buf[].
        */
        nsd = 0;
        if( xtype==JX9_FMT_FLOAT && exp+precision<JX9_FMT_BUFSIZ-30 ){
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;         /* Sign */
          if( exp<0 )  *(zBuf++) = '0';            /* Digits before "." */
          else for(; exp>=0; exp--) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          if( flag_dp ) *(zBuf++) = '.';           /* The decimal point */
          for(exp++; exp<0 && precision>0; precision--, exp++){
            *(zBuf++) = '0';
          }
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          *(zBuf--) = 0;                           /* Null terminate */
          if( flag_rtz && flag_dp ){     /* Remove trailing zeros and "." */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
        }else{    /* etEXP or etGENERIC */
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;   /* Sign */
          *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);  /* First digit */
          if( flag_dp ) *(zBuf++) = '.';     /* Decimal point */
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          zBuf--;                            /* point to last digit */
          if( flag_rtz && flag_dp ){          /* Remove tail zeros */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
          if( exp || flag_exp ){
            *(zBuf++) = pInfo->charset[0];
            if( exp<0 ){ *(zBuf++) = '-'; exp = -exp; } /* sign of exp */
            else       { *(zBuf++) = '+'; }
            if( exp>=100 ){
              *(zBuf++) = (char)((exp/100)+'0');                /* 100's digit */
              exp %= 100;
            }
            *(zBuf++) = (char)(exp/10+'0');                     /* 10's digit */
            *(zBuf++) = (char)(exp%10+'0');                     /* 1's digit */
          }
        }
        /* The converted number is in buf[] and zero terminated.Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions.*/
        length = (int)(zBuf-zWorker);
        zBuf = zWorker;
        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            zBuf[i] = zBuf[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) zBuf[i++] = '0';
          length = width;
        }
#else
         zBuf = " ";
		 length = (int)sizeof(char);
#endif /* JX9_OMIT_FLOATING_POINT */
		 break;
							 }
		default:
			/* Invalid format specifer */
			zWorker[0] = '?';
			length = (int)sizeof(char);
			break;
		}
		 /*
		 ** The text of the conversion is pointed to by "zBuf" and is
		 ** "length" characters long.The field width is "width".Do
		 ** the output.
		 */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
    if( length>0 ){
		rc = xConsumer(pCtx, zBuf, (unsigned int)length, pUserData);
		if( rc != SXRET_OK ){
		  return SXERR_ABORT; /* Consumer routine request an operation abort */
		}
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
 }/* for(;;) */
	return SXRET_OK;
}